

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

hugeint_t duckdb::DecimalScaleUpCheckOperator::Operation<short,duckdb::hugeint_t>
                    (short input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  short sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint8_t in_R8B;
  undefined7 in_register_00000081;
  hugeint_t hVar5;
  unkbyte10 Var6;
  string error;
  hugeint_t result;
  string local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  hugeint_t local_78;
  string local_68;
  string local_48;
  
  sVar1 = *(short *)((long)dataptr + 0x20);
  uVar4 = (uint)input;
  if ((input < sVar1) &&
     (uVar3 = -(int)sVar1, uVar4 != uVar3 && SBORROW4(uVar4,uVar3) == (int)(uVar4 + (int)sVar1) < 0)
     ) {
    bVar2 = TryCast::Operation<short,duckdb::hugeint_t>(input,&local_78,false);
    if (!bVar2) {
      Var6 = __cxa_allocate_exception(0x10);
      CastExceptionText<short,duckdb::hugeint_t>
                (&local_b8,(duckdb *)(ulong)uVar4,(short)((unkuint10)Var6 >> 0x40));
      InvalidInputException::InvalidInputException((InvalidInputException *)Var6,&local_b8);
      __cxa_throw((InvalidInputException *)Var6,&InvalidInputException::typeinfo,
                  ::std::runtime_error::~runtime_error);
    }
    local_b8._M_dataplus._M_p = (pointer)local_78.lower;
    local_b8._M_string_length = local_78.upper;
    hVar5 = hugeint_t::operator*((hugeint_t *)&local_b8,(hugeint_t *)((long)dataptr + 0x28));
  }
  else {
    local_98[0] = local_88;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,"Casting value \"%s\" to type %s failed: value is out of range!",
               "");
    Decimal::ToString_abi_cxx11_
              (&local_48,(Decimal *)(ulong)uVar4,(ushort)*(byte *)((long)dataptr + 0x38),
               *(uint8_t *)((long)dataptr + 0x39),in_R8B);
    LogicalType::ToString_abi_cxx11_(&local_68,(LogicalType *)(*dataptr + 8));
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&local_b8,(StringUtil *)local_98,&local_48,&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000081,in_R8B));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0]);
    }
    hVar5 = HandleVectorCastError::Operation<duckdb::hugeint_t>
                      (&local_b8,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  return hVar5;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}